

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightLeSample * __thiscall
pbrt::PointLight::SampleLe
          (LightLeSample *__return_storage_ptr__,PointLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  undefined8 uVar1;
  uintptr_t uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  SampledSpectrum SVar18;
  undefined1 auVar14 [56];
  undefined1 auVar17 [56];
  
  auVar15 = ZEXT816(0) << 0x40;
  auVar17 = ZEXT856(0);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[0][1] * 0.0)),
                           auVar15,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]))
  ;
  auVar8 = vfmadd231ss_fma(auVar8,auVar15,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  fVar9 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[1][1] * 0.0)),
                           auVar15,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]))
  ;
  auVar8 = vfmadd231ss_fma(auVar8,auVar15,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  fVar4 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           auVar15,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]))
  ;
  auVar8 = vfmadd231ss_fma(auVar8,auVar15,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar15,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]
                                            ));
  auVar12 = vfmadd231ss_fma(auVar12,auVar15,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar5 = auVar12._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  bVar3 = fVar5 == 1.0;
  fVar6 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  auVar8 = vinsertps_avx(ZEXT416((uint)bVar3 * (int)fVar9 + (uint)!bVar3 * (int)(fVar9 / fVar5)),
                         ZEXT416((uint)bVar3 * (int)fVar4 + (uint)!bVar3 * (int)(fVar4 / fVar5)),
                         0x10);
  auVar7 = vfmadd132ss_fma(ZEXT416((uint)(u1->super_Tuple2<pbrt::Point2,_float>).x),
                           SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
  auVar12 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar7,auVar7);
  auVar12 = vmaxss_avx(auVar12,auVar15);
  if (auVar12._0_4_ < 0.0) {
    auVar17 = ZEXT856(0);
    fVar9 = sqrtf(auVar12._0_4_);
  }
  else {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar9 = auVar12._0_4_;
  }
  fVar4 = (u1->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  fVar10 = cosf(fVar4);
  fVar11 = sinf(fVar4);
  uVar2 = (this->super_LightBase).mediumInterface.outside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  fVar4 = this->scale;
  auVar12._4_4_ = fVar4;
  auVar12._0_4_ = fVar4;
  auVar12._8_4_ = fVar4;
  auVar12._12_4_ = fVar4;
  auVar14 = ZEXT856(auVar12._8_8_);
  SVar18 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar16._0_8_ = SVar18.values.values._8_8_;
  auVar16._8_56_ = auVar17;
  auVar13._0_8_ = SVar18.values.values._0_8_;
  auVar13._8_56_ = auVar14;
  auVar15 = vmovlhps_avx(auVar13._0_16_,auVar16._0_16_);
  auVar12 = vinsertps_avx(ZEXT416((uint)(fVar9 * fVar10)),ZEXT416((uint)(fVar9 * fVar11)),0x10);
  (__return_storage_ptr__->L).values.values[0] = auVar15._0_4_ * fVar4;
  (__return_storage_ptr__->L).values.values[1] = auVar15._4_4_ * fVar4;
  (__return_storage_ptr__->L).values.values[2] = auVar15._8_4_ * fVar4;
  (__return_storage_ptr__->L).values.values[3] = auVar15._12_4_ * fVar4;
  uVar1 = vmovlps_avx(auVar8);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar3 * (int)fVar6 + (uint)!bVar3 * (int)(fVar6 / fVar5));
  uVar1 = vmovlps_avx(auVar12);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = auVar7._0_4_;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar2;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0;
  __return_storage_ptr__->pdfDir = 0.07957747;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample PointLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                   SampledWavelengths &lambda, Float time) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Ray ray(p, SampleUniformSphere(u1), time, mediumInterface.outside);
    return LightLeSample(scale * I.Sample(lambda), ray, 1, UniformSpherePDF());
}